

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app_test.cpp
# Opt level: O3

void __thiscall
ot::commissioner::PskdTest_Pskdvalidation_GoodPskdShouldBeAccepted_Test::TestBody
          (PskdTest_Pskdvalidation_GoodPskdShouldBeAccepted_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  pointer *__ptr;
  char *pcVar3;
  shared_ptr<ot::commissioner::CommissionerApp> commApp;
  Error local_1b8;
  AssertHelper local_188;
  undefined8 *local_180;
  undefined1 local_178 [16];
  internal local_168 [8];
  undefined8 *local_160;
  AssertHelper local_158;
  undefined8 local_150;
  undefined1 local_148 [16];
  shared_ptr<ot::commissioner::CommissionerApp> local_138;
  ErrorCode local_124;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined1 local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  undefined8 local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined7 *local_d8;
  undefined8 local_d0;
  undefined7 local_c8;
  undefined1 uStack_c1;
  undefined7 uStack_c0;
  undefined8 local_b9;
  undefined8 uStack_b1;
  undefined8 local_a9;
  undefined8 uStack_a1;
  undefined8 local_99;
  undefined8 uStack_91;
  undefined8 local_89;
  undefined8 uStack_81;
  undefined8 local_79;
  undefined8 uStack_71;
  undefined8 local_69;
  undefined8 uStack_61;
  undefined8 local_59;
  undefined1 uStack_51;
  undefined7 uStack_50;
  undefined1 uStack_49;
  undefined8 uStack_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  undefined8 local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  local_f8 = &local_e8;
  local_120._4_8_ = 0x6400000028;
  local_110 = 0;
  uStack_108 = 0;
  local_100 = 0;
  local_e8._M_allocated_capacity._0_4_ = 0x65726854;
  local_e8._M_allocated_capacity._4_2_ = 0x6461;
  local_f0 = 6;
  local_e8._M_local_buf[6] = '\0';
  local_d8 = &local_c8;
  local_c8 = 0x6d6d6f432d544f;
  uStack_c1 = 0x69;
  uStack_c0 = 0x72656e6f697373;
  local_d0 = 0xf;
  local_40 = &local_30;
  local_b9 = 0;
  uStack_b1 = 0;
  local_a9 = 0;
  uStack_a1 = 0;
  local_99 = 0;
  uStack_91 = 0;
  local_89 = 0;
  uStack_81 = 0;
  local_79 = 0;
  uStack_71 = 0;
  local_69 = 0;
  uStack_61 = 0;
  local_59 = 0;
  uStack_51 = 0;
  uStack_50 = 0;
  uStack_49 = 0;
  uStack_48 = 0;
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  local_120._M_local_buf[0] = '\0';
  local_1b8.mCode = 0x33221100;
  local_1b8._4_4_ = 0x77665544;
  local_1b8.mMessage._M_dataplus._M_p._0_4_ = 0xbbaa9988;
  local_1b8.mMessage._M_dataplus._M_p._4_4_ = 0xffeeddcc;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)((long)&local_b9 + 1),&local_1b8
            );
  local_138.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_138.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  CommissionerAppCreate(&local_1b8,&local_138,(Config *)&local_120);
  local_158.data_ = (AssertHelperData *)((ulong)local_158.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::ErrorCode>
            ((internal *)&local_188,"CommissionerAppCreate(commApp, config)","ErrorCode::kNone",
             &local_1b8,(ErrorCode *)&local_158);
  paVar1 = &local_1b8.mMessage.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1b8.mMessage._M_dataplus._M_p._4_4_,
                  local_1b8.mMessage._M_dataplus._M_p._0_4_) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1b8.mMessage._M_dataplus._M_p._4_4_,
                             local_1b8.mMessage._M_dataplus._M_p._0_4_));
  }
  if (local_188.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b8);
    if (local_180 == (undefined8 *)0x0) {
      pcVar3 = anon_var_dwarf_66ec33 + 9;
    }
    else {
      pcVar3 = (char *)*local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/commissioner_app_test.cpp"
               ,0x6f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if ((long *)CONCAT44(local_1b8._4_4_,local_1b8.mCode) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1b8._4_4_,local_1b8.mCode) + 8))();
    }
  }
  if (local_180 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_180 != local_180 + 2) {
      operator_delete((undefined8 *)*local_180);
    }
    operator_delete(local_180);
  }
  peVar2 = local_138.
           super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_188.data_ = (AssertHelperData *)local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"PSKD01","");
  local_150 = 0;
  local_148[0] = kSuccess;
  local_158.data_ = (AssertHelperData *)local_148;
  (*(peVar2->super_CommissionerHandler)._vptr_CommissionerHandler[0x15])
            (&local_1b8,peVar2,0,0x11223344556677,&local_188,&local_158);
  local_124 = kInvalidArgs;
  testing::internal::CmpHelperNE<ot::commissioner::Error,ot::commissioner::ErrorCode>
            (local_168,"commApp->EnableJoiner(JoinerType::kMeshCoP, eui64, \"PSKD01\")",
             "ErrorCode::kInvalidArgs",&local_1b8,&local_124);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1b8.mMessage._M_dataplus._M_p._4_4_,
                  local_1b8.mMessage._M_dataplus._M_p._0_4_) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1b8.mMessage._M_dataplus._M_p._4_4_,
                             local_1b8.mMessage._M_dataplus._M_p._0_4_));
  }
  if (local_158.data_ != (AssertHelperData *)local_148) {
    operator_delete(local_158.data_);
  }
  if (local_188.data_ != (AssertHelperData *)local_178) {
    operator_delete(local_188.data_);
  }
  if (local_168[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b8);
    if (local_160 == (undefined8 *)0x0) {
      pcVar3 = anon_var_dwarf_66ec33 + 9;
    }
    else {
      pcVar3 = (char *)*local_160;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/commissioner_app_test.cpp"
               ,0x73,pcVar3);
    testing::internal::AssertHelper::operator=(&local_188,(Message *)&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    if ((long *)CONCAT44(local_1b8._4_4_,local_1b8.mCode) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1b8._4_4_,local_1b8.mCode) + 8))();
    }
  }
  if (local_160 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_160 != local_160 + 2) {
      operator_delete((undefined8 *)*local_160);
    }
    operator_delete(local_160);
  }
  if (local_138.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_138.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  Config::~Config((Config *)&local_120);
  return;
}

Assistant:

TEST(PskdTest, Pskdvalidation_GoodPskdShouldBeAccepted)
{
    Config config;
    config.mEnableCcm = false;
    config.mPSKc = {0x00, 0x11, 0x22, 0x33, 0x44, 0x55, 0x66, 0x77, 0x88, 0x99, 0xaa, 0xbb, 0xcc, 0xdd, 0xee, 0xff};

    std::shared_ptr<CommissionerApp> commApp;
    EXPECT_EQ(CommissionerAppCreate(commApp, config), ErrorCode::kNone);

    constexpr uint64_t eui64 = 0x0011223344556677;

    EXPECT_NE(commApp->EnableJoiner(JoinerType::kMeshCoP, eui64, "PSKD01"), ErrorCode::kInvalidArgs);
}